

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O2

uint64_t dg::llvmutils::getConstantValue(Value *op)

{
  uint64_t uVar1;
  
  if ((op != (Value *)0x0) && (op[0x10] == (Value)0x10)) {
    uVar1 = llvm::APInt::getLimitedValue((APInt *)(op + 0x18),0xffffffffffffffff);
    return uVar1;
  }
  return Offset::UNKNOWN;
}

Assistant:

inline uint64_t getConstantValue(const llvm::Value *op) {
    using namespace llvm;

    // FIXME: we should get rid of this dependency
    static_assert(sizeof(Offset::type) == sizeof(uint64_t),
                  "The code relies on Offset::type having 8 bytes");

    uint64_t size = Offset::UNKNOWN;
    if (const ConstantInt *C = dyn_cast<ConstantInt>(op)) {
        size = C->getLimitedValue();
    }

    // size is ~((uint64_t)0) if it is unknown
    return size;
}